

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool CleanProfileSegment(ON_Curve *curve)

{
  uint uVar1;
  ON_NurbsCurve *this;
  bool local_21;
  ON_NurbsCurve *nurbs_curve;
  ON_Curve *curve_local;
  
  this = ON_NurbsCurve::Cast((ON_Object *)curve);
  if (this == (ON_NurbsCurve *)0x0) {
    curve_local._7_1_ = true;
  }
  else {
    ON_NurbsCurve::RemoveSingularSpans(this);
    uVar1 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])();
    local_21 = false;
    if ((uVar1 & 1) != 0) {
      local_21 = ON_NurbsCurve::SpanIsSingular(this,0);
      local_21 = !local_21;
    }
    curve_local._7_1_ = local_21;
  }
  return curve_local._7_1_;
}

Assistant:

static bool CleanProfileSegment( ON_Curve* curve )
{
  ON_NurbsCurve* nurbs_curve = ON_NurbsCurve::Cast(curve);
  if ( nurbs_curve )
  {
    nurbs_curve->RemoveSingularSpans();
    return ( nurbs_curve->IsValid() && false == nurbs_curve->SpanIsSingular(0) );
  }
  
  return true;
}